

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Limb::Initialize
          (RS_Limb *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy,Enum collision_family,ActuationMode wheel_mode)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  element_type *peVar4;
  element_type *peVar5;
  ChFrame<double> *pCVar6;
  long lVar7;
  element_type *peVar8;
  element_type *peVar9;
  ChSystem *pCVar10;
  element_type *peVar11;
  element_type *peVar12;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_shared_ptr<ChLinkMotorRotationAngle>_>_&&>::value,_pair<iterator,_bool>_>
  _Var13;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_shared_ptr<ChLinkMotorRotationSpeed>_>_&&>::value,_pair<iterator,_bool>_>
  _Var14;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
  local_a60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>,_true>
  local_a30;
  undefined1 local_a28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
  local_a20;
  shared_ptr<chrono::ChLinkBase> local_9f0;
  shared_ptr<chrono::ChFunction> local_9e0;
  ChCoordsys<double> local_9d0;
  ChFrame<double> local_998;
  shared_ptr<chrono::ChBodyFrame> local_910;
  shared_ptr<chrono::ChBodyFrame> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0 [32];
  undefined1 local_8b0 [8];
  shared_ptr<chrono::ChLinkMotorRotationAngle> joint_3;
  shared_ptr<chrono::ChFunction_Setpoint> motor_fun_2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
  local_880;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>,_true>
  local_850;
  undefined1 local_848;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
  local_840;
  shared_ptr<chrono::ChLinkBase> local_810;
  shared_ptr<chrono::ChFunction> local_800;
  ChCoordsys<double> local_7f0;
  ChFrame<double> local_7b8;
  shared_ptr<chrono::ChBodyFrame> local_730;
  shared_ptr<chrono::ChBodyFrame> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0 [32];
  undefined1 local_6d0 [8];
  shared_ptr<chrono::ChLinkMotorRotationSpeed> joint_2;
  shared_ptr<chrono::ChFunction_Setpoint> motor_fun_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
  local_6a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>,_true>
  local_670;
  undefined1 local_668;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
  local_660;
  shared_ptr<chrono::ChLinkBase> local_630;
  shared_ptr<chrono::ChFunction> local_620;
  ChCoordsys<double> local_610;
  ChFrame<double> local_5d8;
  shared_ptr<chrono::ChBodyFrame> local_550;
  shared_ptr<chrono::ChBodyFrame> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510 [32];
  undefined1 local_4f0 [8];
  shared_ptr<chrono::ChLinkMotorRotationAngle> joint_1;
  shared_ptr<chrono::ChFunction_Setpoint> motor_fun;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
  local_4b8;
  shared_ptr<chrono::ChLinkBase> local_488;
  ChCoordsys<double> local_478;
  shared_ptr<chrono::ChBody> local_440;
  shared_ptr<chrono::ChBody> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400 [32];
  undefined1 local_3e0 [8];
  shared_ptr<chrono::ChLinkLockLock> joint;
  shared_ptr<chrono::collision::ChCollisionModel> local_3c0;
  ChFrame<double> local_3b0;
  ChQuaternion<double> local_328;
  ChFrame<double> local_308;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
  local_280;
  undefined1 local_278 [8];
  shared_ptr<chrono::robosimian::RS_Part> child;
  undefined1 local_260 [8];
  shared_ptr<chrono::robosimian::RS_Part> parent;
  undefined1 local_248 [4];
  int i;
  ChFrame<double> X_GC;
  undefined1 local_1a0 [8];
  ChFrame<double> X_PC;
  ChFrame<double> X_GP;
  allocator local_79;
  string local_78 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
  local_58;
  undefined1 local_50 [8];
  shared_ptr<chrono::ChBodyAuxRef> child_body;
  shared_ptr<chrono::ChBodyAuxRef> parent_body;
  ActuationMode wheel_mode_local;
  Enum collision_family_local;
  ChVector<double> *rpy_local;
  ChVector<double> *xyz_local;
  shared_ptr<chrono::ChBodyAuxRef> *chassis_local;
  RS_Limb *this_local;
  
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr
            ((shared_ptr<chrono::ChBodyAuxRef> *)
             &child_body.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,chassis);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"link0",&local_79);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>_>
       ::find(&this->m_links,(key_type *)local_78);
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_false,_true>
                         *)&local_58);
  peVar4 = std::
           __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar3->second);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr
            ((shared_ptr<chrono::ChBodyAuxRef> *)local_50,&peVar4->m_body);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  peVar5 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&child_body.
                            super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  pCVar6 = (ChFrame<double> *)(**(code **)(*(long *)peVar5 + 0x1f0))();
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)
             ((long)X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40),pCVar6);
  rpy2quat((ChQuaternion<double> *)
           ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x40),rpy);
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)local_1a0,xyz,
             (ChQuaternion<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  ChFrame<double>::operator*
            ((ChFrame<double> *)local_248,
             (ChFrame<double> *)
             ((long)X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40),(ChFrame<double> *)local_1a0);
  peVar5 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)peVar5);
  for (parent.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_4_ = 0;
      parent.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._4_4_ < 10;
      parent.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._4_4_ = parent.
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_ + 1) {
    child.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>_>
            ::find(&this->m_links,
                   (key_type *)
                   (joints + (long)parent.
                                   super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_ * 0xb0 + 0x20));
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_false,_true>
                           *)&child.
                              super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    std::shared_ptr<chrono::robosimian::RS_Part>::shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Part> *)local_260,&ppVar3->second);
    local_280._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>_>
         ::find(&this->m_links,
                (key_type *)
                (joints + (long)parent.
                                super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_ * 0xb0 + 0x40));
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_false,_true>
                           *)&local_280);
    std::shared_ptr<chrono::robosimian::RS_Part>::shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Part> *)local_278,&ppVar3->second);
    peVar4 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_260);
    this_00 = &child_body.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::shared_ptr<chrono::ChBodyAuxRef>::operator=
              ((shared_ptr<chrono::ChBodyAuxRef> *)this_00,&peVar4->m_body);
    peVar4 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_278);
    std::shared_ptr<chrono::ChBodyAuxRef>::operator=
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_50,&peVar4->m_body);
    peVar5 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
    pCVar6 = (ChFrame<double> *)(**(code **)(*(long *)peVar5 + 0x1f0))();
    ChFrame<double>::operator=
              ((ChFrame<double> *)
               ((long)X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x40),pCVar6);
    lVar7 = (long)parent.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi._4_4_;
    rpy2quat(&local_328,(ChVector<double> *)(joints + lVar7 * 0xb0 + 0x80));
    ChFrame<double>::ChFrame
              (&local_308,(ChVector<double> *)(joints + lVar7 * 0xb0 + 0x68),&local_328);
    ChFrame<double>::operator=((ChFrame<double> *)local_1a0,&local_308);
    ChFrame<double>::~ChFrame(&local_308);
    ChFrame<double>::operator*
              (&local_3b0,
               (ChFrame<double> *)
               ((long)X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x40),(ChFrame<double> *)local_1a0);
    ChFrame<double>::operator=((ChFrame<double> *)local_248,&local_3b0);
    ChFrame<double>::~ChFrame(&local_3b0);
    peVar5 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)peVar5);
    if (parent.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ == 0) {
      std::shared_ptr<chrono::ChBodyAuxRef>::operator=
                ((shared_ptr<chrono::ChBodyAuxRef> *)
                 &child_body.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,chassis);
    }
    peVar4 = std::
             __shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_278);
    RS_Part::AddCollisionShapes(peVar4);
    std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_50);
    ChBody::GetCollisionModel((ChBody *)&local_3c0);
    peVar8 = std::
             __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_3c0);
    (**(code **)(*(long *)peVar8 + 200))(peVar8,collision_family);
    std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_3c0);
    std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_50);
    ChBody::GetCollisionModel
              ((ChBody *)
               &joint.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar8 = std::
             __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&joint.
                              super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    (**(code **)(*(long *)peVar8 + 0xd8))(peVar8,collision_family);
    std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr
              ((shared_ptr<chrono::collision::ChCollisionModel> *)
               &joint.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = std::operator==((shared_ptr<chrono::robosimian::RS_Part> *)local_278,&this->m_wheel);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      chrono::ChBody::SetCollide(SUB81(peVar5,0));
    }
    else {
      peVar5 = std::
               __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      chrono::ChBody::SetCollide(SUB81(peVar5,0));
    }
    if ((joints[(long)parent.
                      super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ * 0xb0 + 0x60] & 1) == 0) {
      iVar2 = std::__cxx11::string::compare
                        (joints + (long)parent.
                                        super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi._4_4_ * 0xb0);
      if (iVar2 == 0) {
        if (wheel_mode == SPEED) {
          chrono_types::make_shared<chrono::ChFunction_Setpoint,_0>();
          chrono_types::make_shared<chrono::ChLinkMotorRotationSpeed,_0>();
          peVar12 = std::
                    __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_6d0);
          std::operator+(local_710,(char *)this);
          std::operator+(local_6f0,local_710);
          ChObj::SetNameString((ChObj *)peVar12,local_6f0);
          std::__cxx11::string::~string((string *)local_6f0);
          std::__cxx11::string::~string((string *)local_710);
          peVar12 = std::
                    __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_6d0);
          std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                    (&local_720,
                     (shared_ptr<chrono::ChBodyAuxRef> *)
                     &child_body.
                      super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                    (&local_730,(shared_ptr<chrono::ChBodyAuxRef> *)local_50);
          calcJointFrame(&local_7f0,(ChFrame<double> *)local_248,
                         (ChVector<double> *)
                         (joints + (long)parent.
                                         super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi._4_4_ * 0xb0 + 0x98));
          ChFrame<double>::ChFrame(&local_7b8,&local_7f0);
          (**(code **)(*(long *)peVar12 + 0x240))(peVar12,&local_720,&local_730,&local_7b8);
          ChFrame<double>::~ChFrame(&local_7b8);
          std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_730);
          std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_720);
          peVar12 = std::
                    __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_6d0);
          std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Setpoint,void>
                    (&local_800,
                     (shared_ptr<chrono::ChFunction_Setpoint> *)
                     &joint_2.
                      super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          ChLinkMotorRotationSpeed::SetSpeedFunction(peVar12,&local_800);
          std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_800);
          peVar5 = std::
                   __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)chassis);
          pCVar10 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar5);
          std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkMotorRotationSpeed,void>
                    (&local_810,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)local_6d0);
          (**(code **)(*(long *)pCVar10 + 0x138))(pCVar10,&local_810);
          std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_810);
          std::
          make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>&>
                    (&local_840,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (joints + (long)parent.
                                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_ * 0xb0),
                     (shared_ptr<chrono::ChLinkMotorRotationSpeed> *)local_6d0);
          _Var14 = std::
                   unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                   ::
                   insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                             ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                               *)&this->m_joints,&local_840);
          local_850._M_cur =
               (__node_type *)
               _Var14.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>,_true>
               ._M_cur;
          local_848 = _Var14.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::~pair(&local_840);
          std::
          make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>&>
                    (&local_880,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (joints + (long)parent.
                                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_ * 0xb0),
                     (shared_ptr<chrono::ChLinkMotorRotationSpeed> *)local_6d0);
          std::
          unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotation>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>>
          ::
          insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotation>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>>
                      *)&this->m_motors,&local_880);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::~pair(&local_880);
          std::shared_ptr<chrono::ChLinkMotorRotation>::operator=
                    (&this->m_wheel_motor,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)local_6d0)
          ;
          std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr
                    ((shared_ptr<chrono::ChLinkMotorRotationSpeed> *)local_6d0);
          std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr
                    ((shared_ptr<chrono::ChFunction_Setpoint> *)
                     &joint_2.
                      super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else {
          chrono_types::make_shared<chrono::ChFunction_Setpoint,_0>();
          chrono_types::make_shared<chrono::ChLinkMotorRotationAngle,_0>();
          peVar11 = std::
                    __shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_8b0);
          std::operator+(local_8f0,(char *)this);
          std::operator+(local_8d0,local_8f0);
          ChObj::SetNameString((ChObj *)peVar11,local_8d0);
          std::__cxx11::string::~string((string *)local_8d0);
          std::__cxx11::string::~string((string *)local_8f0);
          peVar11 = std::
                    __shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_8b0);
          std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                    (&local_900,
                     (shared_ptr<chrono::ChBodyAuxRef> *)
                     &child_body.
                      super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                    (&local_910,(shared_ptr<chrono::ChBodyAuxRef> *)local_50);
          calcJointFrame(&local_9d0,(ChFrame<double> *)local_248,
                         (ChVector<double> *)
                         (joints + (long)parent.
                                         super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi._4_4_ * 0xb0 + 0x98));
          ChFrame<double>::ChFrame(&local_998,&local_9d0);
          (**(code **)(*(long *)peVar11 + 0x240))(peVar11,&local_900,&local_910,&local_998);
          ChFrame<double>::~ChFrame(&local_998);
          std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_910);
          std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_900);
          peVar11 = std::
                    __shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_8b0);
          std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Setpoint,void>
                    (&local_9e0,
                     (shared_ptr<chrono::ChFunction_Setpoint> *)
                     &joint_3.
                      super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          ChLinkMotorRotationAngle::SetAngleFunction(peVar11,&local_9e0);
          std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_9e0);
          peVar5 = std::
                   __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)chassis);
          pCVar10 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar5);
          std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkMotorRotationAngle,void>
                    (&local_9f0,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_8b0);
          (**(code **)(*(long *)pCVar10 + 0x138))(pCVar10,&local_9f0);
          std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_9f0);
          std::
          make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkMotorRotationAngle>&>
                    (&local_a20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (joints + (long)parent.
                                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_ * 0xb0),
                     (shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_8b0);
          _Var13 = std::
                   unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                   ::
                   insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                             ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                               *)&this->m_joints,&local_a20);
          local_a30._M_cur =
               (__node_type *)
               _Var13.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>,_true>
               ._M_cur;
          local_a28 = _Var13.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
          ::~pair(&local_a20);
          std::
          make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkMotorRotationAngle>&>
                    (&local_a60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (joints + (long)parent.
                                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_ * 0xb0),
                     (shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_8b0);
          std::
          unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotation>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>>
          ::
          insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                    ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotation>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>>
                      *)&this->m_motors,&local_a60);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
          ::~pair(&local_a60);
          std::shared_ptr<chrono::ChLinkMotorRotation>::operator=
                    (&this->m_wheel_motor,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_8b0)
          ;
          std::shared_ptr<chrono::ChLinkMotorRotationAngle>::~shared_ptr
                    ((shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_8b0);
          std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr
                    ((shared_ptr<chrono::ChFunction_Setpoint> *)
                     &joint_3.
                      super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
      }
      else {
        chrono_types::make_shared<chrono::ChFunction_Setpoint,_0>();
        chrono_types::make_shared<chrono::ChLinkMotorRotationAngle,_0>();
        peVar11 = std::
                  __shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_4f0);
        std::operator+(local_530,(char *)this);
        std::operator+(local_510,local_530);
        ChObj::SetNameString((ChObj *)peVar11,local_510);
        std::__cxx11::string::~string((string *)local_510);
        std::__cxx11::string::~string((string *)local_530);
        peVar11 = std::
                  __shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_4f0);
        std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                  (&local_540,
                   (shared_ptr<chrono::ChBodyAuxRef> *)
                   &child_body.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                  (&local_550,(shared_ptr<chrono::ChBodyAuxRef> *)local_50);
        calcJointFrame(&local_610,(ChFrame<double> *)local_248,
                       (ChVector<double> *)
                       (joints + (long)parent.
                                       super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi._4_4_ * 0xb0 + 0x98));
        ChFrame<double>::ChFrame(&local_5d8,&local_610);
        (**(code **)(*(long *)peVar11 + 0x240))(peVar11,&local_540,&local_550,&local_5d8);
        ChFrame<double>::~ChFrame(&local_5d8);
        std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_550);
        std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_540);
        peVar11 = std::
                  __shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_4f0);
        std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Setpoint,void>
                  (&local_620,
                   (shared_ptr<chrono::ChFunction_Setpoint> *)
                   &joint_1.
                    super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        ChLinkMotorRotationAngle::SetAngleFunction(peVar11,&local_620);
        std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_620);
        peVar5 = std::
                 __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)chassis);
        pCVar10 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar5);
        std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkMotorRotationAngle,void>
                  (&local_630,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_4f0);
        (**(code **)(*(long *)pCVar10 + 0x138))(pCVar10,&local_630);
        std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_630);
        std::
        make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkMotorRotationAngle>&>
                  (&local_660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (joints + (long)parent.
                                   super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_ * 0xb0),
                   (shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_4f0);
        _Var13 = std::
                 unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                 ::
                 insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                           ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                             *)&this->m_joints,&local_660);
        local_670._M_cur =
             (__node_type *)
             _Var13.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLink>_>,_true>
             ._M_cur;
        local_668 = _Var13.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::~pair(&local_660);
        std::
        make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkMotorRotationAngle>&>
                  (&local_6a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (joints + (long)parent.
                                   super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_ * 0xb0),
                   (shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_4f0);
        std::
        unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotation>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>>
        ::insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotation>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>>
                    *)&this->m_motors,&local_6a0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::~pair(&local_6a0);
        std::shared_ptr<chrono::ChLinkMotorRotationAngle>::~shared_ptr
                  ((shared_ptr<chrono::ChLinkMotorRotationAngle> *)local_4f0);
        std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr
                  ((shared_ptr<chrono::ChFunction_Setpoint> *)
                   &joint_1.
                    super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
    else {
      chrono_types::make_shared<chrono::ChLinkLockLock,_0>();
      peVar9 = std::
               __shared_ptr_access<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3e0);
      std::operator+(local_420,(char *)this);
      std::operator+(local_400,local_420);
      ChObj::SetNameString((ChObj *)peVar9,local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::__cxx11::string::~string((string *)local_420);
      peVar9 = std::
               __shared_ptr_access<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3e0);
      std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                (&local_430,
                 (shared_ptr<chrono::ChBodyAuxRef> *)
                 &child_body.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                (&local_440,(shared_ptr<chrono::ChBodyAuxRef> *)local_50);
      calcJointFrame(&local_478,(ChFrame<double> *)local_248,
                     (ChVector<double> *)
                     (joints + (long)parent.
                                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_ * 0xb0 + 0x98));
      (**(code **)(*(long *)peVar9 + 0x250))(peVar9,&local_430,&local_440,&local_478);
      std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_440);
      std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_430);
      peVar5 = std::
               __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chassis);
      pCVar10 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar5);
      std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkLockLock,void>
                (&local_488,(shared_ptr<chrono::ChLinkLockLock> *)local_3e0);
      (**(code **)(*(long *)pCVar10 + 0x138))(pCVar10,&local_488);
      std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_488);
      std::make_pair<std::__cxx11::string_const&,std::shared_ptr<chrono::ChLinkLockLock>&>
                (&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (joints + (long)parent.
                                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_ * 0xb0),
                 (shared_ptr<chrono::ChLinkLockLock> *)local_3e0);
      std::
      unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
      ::insert<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkLockLock>>>
                ((unordered_map<std::__cxx11::string,std::shared_ptr<chrono::ChLink>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>>
                  *)&this->m_joints,&local_4b8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
      ::~pair(&local_4b8);
      std::shared_ptr<chrono::ChLinkLockLock>::~shared_ptr
                ((shared_ptr<chrono::ChLinkLockLock> *)local_3e0);
    }
    std::shared_ptr<chrono::robosimian::RS_Part>::~shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Part> *)local_278);
    std::shared_ptr<chrono::robosimian::RS_Part>::~shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Part> *)local_260);
  }
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_248);
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_1a0);
  ChFrame<double>::~ChFrame
            ((ChFrame<double> *)
             ((long)X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_50);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
            ((shared_ptr<chrono::ChBodyAuxRef> *)
             &child_body.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void RS_Limb::Initialize(std::shared_ptr<ChBodyAuxRef> chassis,
                         const ChVector<>& xyz,
                         const ChVector<>& rpy,
                         CollisionFamily::Enum collision_family,
                         ActuationMode wheel_mode) {
    // Set absolute position of link0
    auto parent_body = chassis;                               // parent body
    auto child_body = m_links.find("link0")->second->m_body;  // child body
    ChFrame<> X_GP = parent_body->GetFrame_REF_to_abs();      // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                             // global -> child
    child_body->SetFrame_REF_to_abs(X_GC);

    // Traverse chain (base-to-tip)
    //   set absolute position of the child body
    //   add collision shapes on child body
    //   create joint between parent and child
    for (int i = 0; i < num_joints; i++) {
        auto parent = m_links.find(joints[i].linkA)->second;       // parent part
        auto child = m_links.find(joints[i].linkB)->second;        // child part
        parent_body = parent->m_body;                              // parent body
        child_body = child->m_body;                                // child body
        X_GP = parent_body->GetFrame_REF_to_abs();                 // global -> parent
        X_PC = ChFrame<>(joints[i].xyz, rpy2quat(joints[i].rpy));  // parent -> child
        X_GC = X_GP * X_PC;                                        // global -> child
        child_body->SetFrame_REF_to_abs(X_GC);

        // First joint connects directly to chassis
        if (i == 0)
            parent_body = chassis;

        // Add contact geometry to child body
        child->AddCollisionShapes();

        // Place all links from this limb in the same collision family
        child_body->GetCollisionModel()->SetFamily(collision_family);
        child_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(collision_family);

        // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
        if (child == m_wheel)
            child_body->SetCollide(m_collide_wheel);
        else
            child_body->SetCollide(m_collide_links);

        // Weld joints
        if (joints[i].fixed) {
            auto joint = chrono_types::make_shared<ChLinkLockLock>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, calcJointFrame(X_GC, joints[i].axis));
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Actuated joints (except the wheel motor joint)
        if (joints[i].name.compare("joint8") != 0) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Wheel motor joint
        if (wheel_mode == ActuationMode::SPEED) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetSpeedFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        } else {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        }
    }
}